

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O0

void __thiscall ValidateFootprint::CheckOrder(ValidateFootprint *this)

{
  char local_1a [8];
  char idName [10];
  ValidateFootprint *this_local;
  
  idName._2_8_ = this;
  if ((this->fr_).event_id < this->prevEventID_) {
    strcpy(local_1a,"Event");
  }
  else {
    if (this->prevAreaPerilID_ <= (this->fr_).super_EventRow.areaperil_id) {
      return;
    }
    if ((this->fr_).event_id != this->prevEventID_) {
      return;
    }
    strcpy(local_1a,"Areaperil");
  }
  fprintf(_stderr,"%s IDs in lines %d and %d are not in ascending order:\n%s\n%s\n",local_1a,
          (ulong)((this->super_Validate).lineno_ - 1),(ulong)(uint)(this->super_Validate).lineno_,
          this->prevLine_,&this->super_Validate);
  Validate::PrintErrorMessage(&this->super_Validate);
  return;
}

Assistant:

inline void ValidateFootprint::CheckOrder() {
/* Check event IDs and areaperil IDs are in ascending order. */

  char idName[10];

  if (fr_.event_id < prevEventID_) {

    strcpy(idName, "Event");

  } else if ((fr_.areaperil_id < prevAreaPerilID_) &&
	     (fr_.event_id == prevEventID_)) {

    strcpy(idName, "Areaperil");

  } else return;

  fprintf(stderr, "%s IDs in lines %d and %d are not in ascending"
		  " order:\n%s\n%s\n",
	  idName, lineno_ - 1, lineno_, prevLine_, line_);
  PrintErrorMessage();

}